

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::GetSynchControllersForObjects
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,IPalObject **rgObjects,
          DWORD dwObjectCount,void **ppvControllers,ControllerType ctCtrlrType)

{
  ControllerType CVar1;
  IPalObject **ppIVar2;
  CPalThread *pCVar3;
  uint uVar4;
  DWORD DVar5;
  int iVar6;
  DWORD DVar7;
  ObjectDomain odObjectDomain;
  PAL_ERROR PVar8;
  undefined8 psdSynchData;
  undefined4 extraout_var;
  WaitDomain WVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  CSynchCache<CorUnix::CSynchStateController> *this_00;
  CSynchCache<CorUnix::CSynchWaitController> *this_01;
  long lVar14;
  CSynchWaitController *local_288;
  anon_union_512_2_150356a7 Ctrlrs;
  void *pvSData;
  CProcProcessLocalData *pProcLocData;
  IDataLock *pDataLock;
  void **local_68;
  WaitDomain local_5c;
  ulong local_58;
  ControllerType local_4c;
  IPalObject **local_48;
  CPalThread *local_40;
  PAL_ERROR local_34;
  undefined7 uVar13;
  
  local_48 = rgObjects;
  if (dwObjectCount - 0x41 < 0xffffffc0) {
    uVar12 = 0;
    PVar8 = 0x57;
  }
  else {
    uVar12 = (ulong)ctCtrlrType;
    pDataLock = (IDataLock *)this;
    if (ctCtrlrType == WaitController) {
      uVar4 = CSynchCache<CorUnix::CSynchWaitController>::Get
                        (&this->m_cacheWaitCtrlrs,pthrCurrent,dwObjectCount,&local_288);
    }
    else {
      uVar4 = CSynchCache<CorUnix::CSynchStateController>::Get
                        (&this->m_cacheStateCtrlrs,pthrCurrent,dwObjectCount,
                         (CSynchStateController **)&local_288);
    }
    local_4c = ctCtrlrType;
    local_40 = pthrCurrent;
    if (uVar4 < dwObjectCount) {
      PVar8 = 8;
      uVar10 = 0;
      uVar12 = 0;
    }
    else {
      local_68 = ppvControllers;
      AcquireLocalSynchLock(pthrCurrent);
      uVar10 = 0;
      DVar7 = 0;
      WVar9 = LocalWait;
      local_58 = (ulong)dwObjectCount;
      if (dwObjectCount != 0) {
        uVar12 = (ulong)dwObjectCount;
        uVar11 = 0;
        DVar5 = 0;
        do {
          iVar6 = (*local_48[uVar11]->_vptr_IPalObject[9])();
          DVar7 = DVar5 + (iVar6 == 1);
          if (((iVar6 == 1) + DVar5) - 1 < uVar11) {
            WVar9 = MixedWait;
            goto LAB_001d9804;
          }
          uVar11 = uVar11 + 1;
          DVar5 = DVar7;
        } while (uVar12 != uVar11);
        WVar9 = LocalWait;
LAB_001d9804:
        dwObjectCount = (DWORD)local_58;
      }
      local_5c = SharedWait;
      if (DVar7 != dwObjectCount) {
        local_5c = WVar9;
      }
      PVar8 = 0;
      if (dwObjectCount != 0) {
        uVar10 = 0;
        do {
          ppIVar2 = local_48;
          odObjectDomain = (*local_48[uVar10]->_vptr_IPalObject[9])();
          PVar8 = (*ppIVar2[uVar10]->_vptr_IPalObject[10])
                            (ppIVar2[uVar10],Ctrlrs.pWaitCtrlrs + 0x3f);
          if (PVar8 == 0) {
            psdSynchData = Ctrlrs.pWaitCtrlrs[0x3f];
            local_34 = PVar8;
            if (odObjectDomain == SharedObject) {
              psdSynchData = SHMPtrToPtr((SHMPTR)Ctrlrs.pWaitCtrlrs[0x3f]);
            }
            iVar6 = (**local_48[uVar10]->_vptr_IPalObject)();
            CVar1 = local_4c;
            CSynchControllerBase::Init
                      (&(&local_288)[uVar10]->super_CSynchControllerBase,local_40,local_4c,
                       odObjectDomain,(CObjectType *)CONCAT44(extraout_var,iVar6),
                       (CSynchData *)psdSynchData,local_5c);
            pCVar3 = local_40;
            uVar13 = (undefined7)((ulong)psdSynchData >> 8);
            uVar12 = CONCAT71(uVar13,1);
            PVar8 = local_34;
            if ((CVar1 == WaitController) &&
               (((CObjectType *)CONCAT44(extraout_var,iVar6))->m_eTypeId == otiProcess)) {
              PVar8 = (*local_48[uVar10]->_vptr_IPalObject[3])
                                (local_48[uVar10],local_40,0,&pProcLocData,&pvSData);
              uVar12 = CONCAT71(uVar13,PVar8 == 0);
              if (PVar8 == 0) {
                CSynchWaitController::SetProcessLocalData
                          ((&local_288)[uVar10],(CProcProcessLocalData *)pvSData);
                (*(code *)**(undefined8 **)pProcLocData)(pProcLocData,pCVar3,0);
              }
              else {
                uVar10 = uVar10 + 1;
              }
            }
          }
          else {
            uVar12 = 0;
          }
          if ((char)uVar12 == '\0') break;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (uint)local_58);
      }
      uVar12 = CONCAT71((int7)(uVar12 >> 8),1);
      uVar4 = (uint)local_58;
      if (PVar8 == 0) {
        pthrCurrent = local_40;
        if (local_4c == WaitController) {
          uVar12 = 1;
          if (uVar4 != 0) {
            uVar11 = 0;
            do {
              local_68[uVar11] = (&local_288)[uVar11];
              uVar11 = uVar11 + 1;
            } while ((local_58 & 0xffffffff) != uVar11);
          }
        }
        else {
          uVar12 = 1;
          if (uVar4 != 0) {
            uVar11 = 0;
            do {
              local_68[uVar11] = (&local_288)[uVar11];
              uVar11 = uVar11 + 1;
            } while ((local_58 & 0xffffffff) != uVar11);
          }
        }
        goto LAB_001d9a16;
      }
    }
    local_34 = PVar8;
    if (local_4c == WaitController) {
      if (uVar10 != 0) {
        uVar11 = 0;
        do {
          CSynchControllerBase::Release(&(&local_288)[uVar11]->super_CSynchControllerBase);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      pthrCurrent = local_40;
      PVar8 = local_34;
      if (uVar4 <= uVar10) goto LAB_001d9a16;
      local_48 = (IPalObject **)CONCAT44(local_48._4_4_,(int)uVar12);
      this_01 = (CSynchCache<CorUnix::CSynchWaitController> *)(pDataLock + 8);
      lVar14 = 0;
      do {
        CSynchCache<CorUnix::CSynchWaitController>::Add
                  (this_01,pthrCurrent,(&local_288)[(ulong)uVar10 + lVar14]);
        lVar14 = lVar14 + 1;
      } while (uVar4 - uVar10 != (int)lVar14);
    }
    else {
      if (uVar10 != 0) {
        uVar11 = 0;
        do {
          CSynchControllerBase::Release(&(&local_288)[uVar11]->super_CSynchControllerBase);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      pthrCurrent = local_40;
      PVar8 = local_34;
      if (uVar4 <= uVar10) goto LAB_001d9a16;
      local_48 = (IPalObject **)CONCAT44(local_48._4_4_,(int)uVar12);
      this_00 = (CSynchCache<CorUnix::CSynchStateController> *)(pDataLock + 0x1d);
      lVar14 = 0;
      do {
        CSynchCache<CorUnix::CSynchStateController>::Add
                  (this_00,pthrCurrent,(CSynchStateController *)(&local_288)[(ulong)uVar10 + lVar14]
                  );
        lVar14 = lVar14 + 1;
      } while (uVar4 - uVar10 != (int)lVar14);
    }
    uVar12 = (ulong)local_48 & 0xffffffff;
    PVar8 = local_34;
  }
LAB_001d9a16:
  if ((char)uVar12 != '\0') {
    ReleaseLocalSynchLock(pthrCurrent);
  }
  return PVar8;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::GetSynchControllersForObjects(
        CPalThread *pthrCurrent,
        IPalObject *rgObjects[],
        DWORD dwObjectCount,
        void ** ppvControllers,
        CSynchControllerBase::ControllerType ctCtrlrType)
    {
        PAL_ERROR palErr = NO_ERROR;
        unsigned int uIdx, uCount = 0, uSharedObjectCount = 0;
        WaitDomain wdWaitDomain = LocalWait;
        CObjectType * potObjectType = NULL;
        unsigned int uErrCleanupIdxFirstNotInitializedCtrlr = 0;
        unsigned int uErrCleanupIdxLastCtrlr = 0;
        bool fLocalSynchLock = false;
        union
        {
            CSynchWaitController * pWaitCtrlrs[MAXIMUM_WAIT_OBJECTS];
            CSynchStateController * pStateCtrlrs[MAXIMUM_WAIT_OBJECTS];
        } Ctrlrs;

        if ((dwObjectCount <= 0) || (dwObjectCount > MAXIMUM_WAIT_OBJECTS))
        {
            palErr = ERROR_INVALID_PARAMETER;
            goto GSCFO_exit;
        }

        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            uCount = (unsigned int)m_cacheWaitCtrlrs.Get(pthrCurrent,
                                                         dwObjectCount,
                                                         Ctrlrs.pWaitCtrlrs);
        }
        else
        {
            uCount = (unsigned int)m_cacheStateCtrlrs.Get(pthrCurrent,
                                                          dwObjectCount,
                                                          Ctrlrs.pStateCtrlrs);
        }
        if (uCount < dwObjectCount)
        {
            // We got less controllers (uCount) than we asked for (dwObjectCount),
            // probably because of low memory.
            // None of these controllers is initialized, so they must be all
            // returned directly to the cache
            uErrCleanupIdxLastCtrlr = uCount;

            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto GSCFO_error_cleanup;
        }

        //
        // We need to acquire the local synch lock before evaluating object
        // domains
        //
        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        for (uIdx=0; uIdx<dwObjectCount; uIdx++)
        {
            if (SharedObject == rgObjects[uIdx]->GetObjectDomain())
            {
                ++uSharedObjectCount;
            }
            if (uSharedObjectCount > 0 && uSharedObjectCount <= uIdx)
            {
                wdWaitDomain = MixedWait;
                break;
            }
        }
        if (dwObjectCount == uSharedObjectCount)
        {
            wdWaitDomain = SharedWait;
        }

        for (uIdx=0;uIdx<dwObjectCount;uIdx++)
        {
            void * pvSData;
            CSynchData * psdSynchData;
            ObjectDomain odObjectDomain = rgObjects[uIdx]->GetObjectDomain();

            palErr = rgObjects[uIdx]->GetObjectSynchData((void **)&pvSData);
            if (NO_ERROR != palErr)
            {
                break;
            }

            psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
                CSynchData, reinterpret_cast<SharedID>(pvSData)) :
                static_cast<CSynchData *>(pvSData);

            VALIDATEOBJECT(psdSynchData);

            potObjectType = rgObjects[uIdx]->GetObjectType();


            if (CSynchControllerBase::WaitController == ctCtrlrType)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Init(pthrCurrent,
                                            ctCtrlrType,
                                            odObjectDomain,
                                            potObjectType,
                                            psdSynchData,
                                            wdWaitDomain);
            }
            else
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Init(pthrCurrent,
                                             ctCtrlrType,
                                             odObjectDomain,
                                             potObjectType,
                                             psdSynchData,
                                             wdWaitDomain);
            }

            if (CSynchControllerBase::WaitController == ctCtrlrType &&
                otiProcess == potObjectType->GetId())
            {
                CProcProcessLocalData * pProcLocData;
                IDataLock * pDataLock;

                palErr = rgObjects[uIdx]->GetProcessLocalData(
                    pthrCurrent,
                    ReadLock,
                    &pDataLock,
                    (void **)&pProcLocData);
                if (NO_ERROR != palErr)
                {
                    // In case of failure here, bail out of the loop, but
                    // keep track (by incrementing the counter 'uIdx') of the
                    // fact that this controller has already being initialized
                    // and therefore need to be Release'd rather than just
                    // returned to the cache
                    uIdx++;
                    break;
                }

                Ctrlrs.pWaitCtrlrs[uIdx]->SetProcessLocalData(pProcLocData);
                pDataLock->ReleaseLock(pthrCurrent, false);
            }
        }
        if (NO_ERROR != palErr)
        {
            // An error occurred while initializing the (uIdx+1)-th controller,
            // i.e. the one at index uIdx; therefore the first uIdx controllers
            // must be Release'd, while the remaining uCount-uIdx must be returned
            // directly to the cache.
            uErrCleanupIdxFirstNotInitializedCtrlr = uIdx;
            uErrCleanupIdxLastCtrlr = dwObjectCount;

            goto GSCFO_error_cleanup;
        }

        // Succeeded
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // The multiple cast is NEEDED, though currently it does not
                // change the value ot the pointer. Anyway, if in the future
                // a virtual method should be added to the base class
                // CSynchControllerBase, both derived classes would have two
                // virtual tables, therefore a static cast from, for instance,
                // a CSynchWaitController* to a ISynchWaitController* would
                // return the given pointer incremented by the size of a
                // generic pointer on the specific platform

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchWaitController *>(Ctrlrs.pWaitCtrlrs[uIdx]));
            }
        }
        else
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // See comment above

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchStateController *>(Ctrlrs.pStateCtrlrs[uIdx]));
            }
        }

        // Succeeded: skip error cleanup
        goto GSCFO_exit;

    GSCFO_error_cleanup:
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            // Release already initialized wait controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized wait controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheWaitCtrlrs.Add(pthrCurrent, Ctrlrs.pWaitCtrlrs[uIdx]);
            }
        }
        else
        {
            // Release already initialized state controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized state controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheStateCtrlrs.Add(pthrCurrent, Ctrlrs.pStateCtrlrs[uIdx]);
            }
        }

    GSCFO_exit:

        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        return palErr;
    }